

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

shared_ptr<wallet::CWallet>
wallet::LoadWallet(WalletContext *context,string *name,optional<bool> load_on_start,
                  DatabaseOptions *options,DatabaseStatus *status,bilingual_str *error,
                  vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  long lVar1;
  undefined2 in_CX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char *in_R9;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  shared_ptr<wallet::CWallet> sVar4;
  GlobalMutex *in_stack_00000008;
  shared_ptr<wallet::CWallet> *wallet;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  result;
  bilingual_str *in_stack_00000350;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_00000358;
  bilingual_str *in_stack_fffffffffffffee8;
  bilingual_str *in_stack_fffffffffffffef0;
  bilingual_str *in_stack_fffffffffffffef8;
  element_type *this;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  allocator<char> *in_stack_ffffffffffffff28;
  allocator<char> local_99;
  DatabaseOptions *local_98;
  undefined1 local_90;
  undefined6 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff91;
  WalletContext *in_stack_ffffffffffffff98;
  _Optional_payload_base<bool> in_stack_ffffffffffffffde;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  MaybeCheckNotHeld<GlobalMutex>((GlobalMutex *)in_stack_fffffffffffffee8);
  pVar3 = LoadWallet(wallet::WalletContext&,std::__cxx11::string_const&,std::optional<bool>,wallet::DatabaseOptions_const&,wallet::DatabaseStatus&,bilingual_str&,std::vector<bilingual_str,std::allocator<bilingual_str>>&)
          ::$_0::operator()[abi_cxx11_((anon_class_8_1_898f2789 *)in_stack_ffffffffffffff28);
  local_98 = (DatabaseOptions *)pVar3.first._M_node;
  local_90 = pVar3.second;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_R8,in_R9,in_stack_ffffffffffffff28);
    Untranslated((string *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    bilingual_str::operator=(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    bilingual_str::~bilingual_str(in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(&in_stack_fffffffffffffee8->original);
    std::allocator<char>::~allocator(&local_99);
    in_R9[0] = '\a';
    in_R9[1] = '\0';
    in_R9[2] = '\0';
    in_R9[3] = '\0';
    std::shared_ptr<wallet::CWallet>::shared_ptr
              ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffee8,(nullptr_t)0x16ef681);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    anon_unknown_48::LoadWalletInternal
              (in_stack_ffffffffffffff98,(string *)CONCAT71(in_stack_ffffffffffffff91,local_90),
               (optional<bool>)in_stack_ffffffffffffffde,local_98,
               (DatabaseStatus *)CONCAT26(in_CX,in_stack_ffffffffffffff80),in_stack_00000350,
               in_stack_00000358);
    MaybeCheckNotHeld<GlobalMutex>(in_stack_00000008);
    LoadWallet::anon_class_8_1_6971b95b::operator()((anon_class_8_1_6971b95b *)this);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<wallet::CWallet>)
         sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CWallet> LoadWallet(WalletContext& context, const std::string& name, std::optional<bool> load_on_start, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    auto result = WITH_LOCK(g_loading_wallet_mutex, return g_loading_wallet_set.insert(name));
    if (!result.second) {
        error = Untranslated("Wallet already loading.");
        status = DatabaseStatus::FAILED_LOAD;
        return nullptr;
    }
    auto wallet = LoadWalletInternal(context, name, load_on_start, options, status, error, warnings);
    WITH_LOCK(g_loading_wallet_mutex, g_loading_wallet_set.erase(result.first));
    return wallet;
}